

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::prependGraphicsTransform(QGraphicsItemPrivate *this,QGraphicsTransform *t)

{
  long lVar1;
  bool bVar2;
  QGraphicsTransformPrivate *this_00;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *q;
  parameter_type in_stack_ffffffffffffffc8;
  TransformData *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->transformData == (TransformData *)0x0) {
    in_stack_ffffffffffffffd0 = (TransformData *)operator_new(0x90);
    TransformData::TransformData(in_stack_ffffffffffffffd0);
    in_RDI->transformData = in_stack_ffffffffffffffd0;
  }
  bVar2 = QListSpecialMethodsBase<QGraphicsTransform*>::contains<QGraphicsTransform*>
                    ((QListSpecialMethodsBase<QGraphicsTransform_*> *)in_stack_ffffffffffffffd0,
                     (QGraphicsTransform **)in_stack_ffffffffffffffc8);
  if (!bVar2) {
    QList<QGraphicsTransform_*>::prepend
              ((QList<QGraphicsTransform_*> *)0x97ebd4,in_stack_ffffffffffffffc8);
  }
  this_00 = (QGraphicsTransformPrivate *)q_func(in_RDI);
  QGraphicsTransform::d_func((QGraphicsTransform *)0x97ebed);
  QGraphicsTransformPrivate::setItem(this_00,(QGraphicsItem *)in_RDI);
  in_RDI->transformData->onlyTransform = false;
  in_RDI->field_0x166 = in_RDI->field_0x166 | 0x20;
  (*in_RDI->_vptr_QGraphicsItemPrivate[4])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::prependGraphicsTransform(QGraphicsTransform *t)
{
    if (!transformData)
        transformData = new QGraphicsItemPrivate::TransformData;
    if (!transformData->graphicsTransforms.contains(t))
        transformData->graphicsTransforms.prepend(t);

    Q_Q(QGraphicsItem);
    t->d_func()->setItem(q);
    transformData->onlyTransform = false;
    dirtySceneTransform = 1;
    transformChanged();
}